

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.c
# Opt level: O2

int QEMU_AES_set_encrypt_key(uchar *userKey,int bits,AES_KEY *key)

{
  int iVar1;
  uint uVar2;
  uint32_t *puVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  
  if (key == (AES_KEY *)0x0 || userKey == (uchar *)0x0) {
    iVar1 = -1;
  }
  else if (((bits == 0x80) || (bits == 0x100)) || (bits == 0xc0)) {
    if (bits == 0x80) {
      key->rounds = 10;
    }
    else if (bits == 0xc0) {
      key->rounds = 0xc;
    }
    else {
      key->rounds = 0xe;
    }
    uVar7 = *(uint *)userKey;
    uVar2 = uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18;
    key->rd_key[0] = uVar2;
    uVar7 = *(uint *)(userKey + 4);
    uVar4 = uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18;
    key->rd_key[1] = uVar4;
    uVar7 = *(uint *)(userKey + 8);
    uVar5 = uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18;
    key->rd_key[2] = uVar5;
    uVar7 = *(uint *)(userKey + 0xc);
    uVar7 = uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18;
    key->rd_key[3] = uVar7;
    if (bits == 0x80) {
      iVar1 = 0;
      lVar6 = 0;
      do {
        uVar7 = key->rd_key[lVar6 + 3];
        uVar2 = (uint)(byte)AES_Te4[uVar7 >> 0x18] ^
                (uint)*(byte *)((long)AES_Te4 + (ulong)(uVar7 & 0xff) * 4 + 1) << 8 ^
                (uint)*(byte *)((long)AES_Te4 + (ulong)(uVar7 >> 8 & 0xff) * 4 + 2) << 0x10 ^
                (uint)*(byte *)((long)AES_Te4 + (ulong)(uVar7 >> 0xe & 0x3fc) + 3) << 0x18 ^ uVar2 ^
                *(uint *)((long)rcon + lVar6);
        key->rd_key[lVar6 + 4] = uVar2;
        uVar4 = key->rd_key[lVar6 + 1] ^ uVar2;
        key->rd_key[lVar6 + 5] = uVar4;
        uVar4 = uVar4 ^ key->rd_key[lVar6 + 2];
        key->rd_key[lVar6 + 6] = uVar4;
        key->rd_key[lVar6 + 7] = uVar4 ^ uVar7;
        lVar6 = lVar6 + 4;
      } while (lVar6 != 0x28);
    }
    else {
      uVar8 = *(uint *)(userKey + 0x10);
      key->rd_key[4] =
           uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18;
      uVar8 = *(uint *)(userKey + 0x14);
      uVar8 = uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18;
      key->rd_key[5] = uVar8;
      if (bits == 0xc0) {
        puVar3 = key->rd_key + 0xb;
        iVar1 = 0;
        lVar6 = 0;
        while( true ) {
          uVar2 = (uint)(byte)AES_Te4[uVar8 >> 0x18] ^
                  (uint)*(byte *)((long)AES_Te4 + (ulong)(uVar8 & 0xff) * 4 + 1) << 8 ^
                  (uint)*(byte *)((long)AES_Te4 + (ulong)(uVar8 >> 8 & 0xff) * 4 + 2) << 0x10 ^
                  (uint)*(byte *)((long)AES_Te4 + (ulong)(uVar8 >> 0xe & 0x3fc) + 3) << 0x18 ^ uVar2
                  ^ *(uint *)((long)rcon + lVar6);
          puVar3[-5] = uVar2;
          uVar4 = uVar4 ^ uVar2;
          puVar3[-4] = uVar4;
          uVar5 = uVar5 ^ uVar4;
          puVar3[-3] = uVar5;
          uVar7 = uVar7 ^ uVar5;
          puVar3[-2] = uVar7;
          if (lVar6 == 0x1c) break;
          puVar3[-1] = puVar3[-7] ^ uVar7;
          uVar8 = uVar8 ^ puVar3[-7] ^ uVar7;
          *puVar3 = uVar8;
          lVar6 = lVar6 + 4;
          puVar3 = puVar3 + 6;
        }
      }
      else {
        uVar8 = *(uint *)(userKey + 0x18);
        key->rd_key[6] =
             uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18;
        uVar8 = *(uint *)(userKey + 0x1c);
        uVar8 = uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18;
        key->rd_key[7] = uVar8;
        if (bits != 0x100) {
          abort();
        }
        iVar1 = 0;
        lVar6 = 0;
        while( true ) {
          uVar2 = (uint)(byte)AES_Te4[uVar8 >> 0x18] ^
                  (uint)*(byte *)((long)AES_Te4 + (ulong)(uVar8 & 0xff) * 4 + 1) << 8 ^
                  (uint)*(byte *)((long)AES_Te4 + (ulong)(uVar8 >> 8 & 0xff) * 4 + 2) << 0x10 ^
                  (uint)*(byte *)((long)AES_Te4 + (ulong)(uVar8 >> 0xe & 0x3fc) + 3) << 0x18 ^ uVar2
                  ^ *(uint *)((long)rcon + lVar6);
          key->rd_key[lVar6 * 2 + 8] = uVar2;
          uVar4 = uVar4 ^ uVar2;
          key->rd_key[lVar6 * 2 + 9] = uVar4;
          uVar5 = uVar5 ^ uVar4;
          key->rd_key[lVar6 * 2 + 10] = uVar5;
          uVar7 = uVar7 ^ uVar5;
          key->rd_key[lVar6 * 2 + 0xb] = uVar7;
          if (lVar6 == 0x18) break;
          uVar9 = (uint)(byte)AES_Te4[uVar7 & 0xff] ^
                  (uint)*(byte *)((long)AES_Te4 + (ulong)(uVar7 >> 8 & 0xff) * 4 + 1) << 8 ^
                  (uint)*(byte *)((long)AES_Te4 + (ulong)(uVar7 >> 0xe & 0x3fc) + 2) << 0x10 ^
                  (uint)*(byte *)((long)AES_Te4 + (ulong)(uVar7 >> 0x18) * 4 + 3) << 0x18 ^
                  key->rd_key[lVar6 * 2 + 4];
          key->rd_key[lVar6 * 2 + 0xc] = uVar9;
          uVar9 = uVar9 ^ key->rd_key[lVar6 * 2 + 5];
          key->rd_key[lVar6 * 2 + 0xd] = uVar9;
          uVar9 = uVar9 ^ key->rd_key[lVar6 * 2 + 6];
          key->rd_key[lVar6 * 2 + 0xe] = uVar9;
          uVar8 = uVar8 ^ uVar9;
          key->rd_key[lVar6 * 2 + 0xf] = uVar8;
          lVar6 = lVar6 + 4;
        }
      }
    }
  }
  else {
    iVar1 = -2;
  }
  return iVar1;
}

Assistant:

int AES_set_encrypt_key(const unsigned char *userKey, const int bits,
                        AES_KEY *key) {

        u32 *rk;
        int i = 0;
        u32 temp;

        if (!userKey || !key)
                return -1;
        if (bits != 128 && bits != 192 && bits != 256)
                return -2;

        rk = key->rd_key;

        if (bits==128)
                key->rounds = 10;
        else if (bits==192)
                key->rounds = 12;
        else
                key->rounds = 14;

        rk[0] = GETU32(userKey     );
        rk[1] = GETU32(userKey +  4);
        rk[2] = GETU32(userKey +  8);
        rk[3] = GETU32(userKey + 12);
        if (bits == 128) {
                while (1) {
                        temp  = rk[3];
                        rk[4] = rk[0] ^
                                (AES_Te4[(temp >> 16) & 0xff] & 0xff000000) ^
                                (AES_Te4[(temp >>  8) & 0xff] & 0x00ff0000) ^
                                (AES_Te4[(temp      ) & 0xff] & 0x0000ff00) ^
                                (AES_Te4[(temp >> 24)       ] & 0x000000ff) ^
                                rcon[i];
                        rk[5] = rk[1] ^ rk[4];
                        rk[6] = rk[2] ^ rk[5];
                        rk[7] = rk[3] ^ rk[6];
                        if (++i == 10) {
                                return 0;
                        }
                        rk += 4;
                }
        }
        rk[4] = GETU32(userKey + 16);
        rk[5] = GETU32(userKey + 20);
        if (bits == 192) {
                while (1) {
                        temp = rk[ 5];
                        rk[ 6] = rk[ 0] ^
                                (AES_Te4[(temp >> 16) & 0xff] & 0xff000000) ^
                                (AES_Te4[(temp >>  8) & 0xff] & 0x00ff0000) ^
                                (AES_Te4[(temp      ) & 0xff] & 0x0000ff00) ^
                                (AES_Te4[(temp >> 24)       ] & 0x000000ff) ^
                                rcon[i];
                        rk[ 7] = rk[ 1] ^ rk[ 6];
                        rk[ 8] = rk[ 2] ^ rk[ 7];
                        rk[ 9] = rk[ 3] ^ rk[ 8];
                        if (++i == 8) {
                                return 0;
                        }
                        rk[10] = rk[ 4] ^ rk[ 9];
                        rk[11] = rk[ 5] ^ rk[10];
                        rk += 6;
                }
        }
        rk[6] = GETU32(userKey + 24);
        rk[7] = GETU32(userKey + 28);
        if (bits == 256) {
                while (1) {
                        temp = rk[ 7];
                        rk[ 8] = rk[ 0] ^
                                (AES_Te4[(temp >> 16) & 0xff] & 0xff000000) ^
                                (AES_Te4[(temp >>  8) & 0xff] & 0x00ff0000) ^
                                (AES_Te4[(temp      ) & 0xff] & 0x0000ff00) ^
                                (AES_Te4[(temp >> 24)       ] & 0x000000ff) ^
                                rcon[i];
                        rk[ 9] = rk[ 1] ^ rk[ 8];
                        rk[10] = rk[ 2] ^ rk[ 9];
                        rk[11] = rk[ 3] ^ rk[10];
                        if (++i == 7) {
                                return 0;
                        }
                        temp = rk[11];
                        rk[12] = rk[ 4] ^
                                (AES_Te4[(temp >> 24)       ] & 0xff000000) ^
                                (AES_Te4[(temp >> 16) & 0xff] & 0x00ff0000) ^
                                (AES_Te4[(temp >>  8) & 0xff] & 0x0000ff00) ^
                                (AES_Te4[(temp      ) & 0xff] & 0x000000ff);
                        rk[13] = rk[ 5] ^ rk[12];
                        rk[14] = rk[ 6] ^ rk[13];
                        rk[15] = rk[ 7] ^ rk[14];

                        rk += 8;
                }
        }
        abort();
}